

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3CodeRowTrigger
               (Parse *pParse,Trigger *pTrigger,int op,ExprList *pChanges,int tr_tm,Table *pTab,
               int reg,int orconf,int ignoreJump)

{
  undefined1 *puVar1;
  uint p2;
  sqlite3 *db;
  Vdbe *p;
  Returning *pRVar2;
  ExprList *pEVar3;
  sqlite3 *db_00;
  char cVar4;
  int iVar5;
  Expr *pEVar6;
  ExprList *pList;
  char *pcVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  NameContext local_168;
  Select sSelect;
  SrcList sFrom;
  
  do {
    if (pTrigger == (Trigger *)0x0) {
      return;
    }
    if ((((uint)pTrigger->op == op) ||
        (((pTrigger->bReturning != '\0' && (op == 0x81)) && (pTrigger->op == 0x7f)))) &&
       (((uint)pTrigger->tr_tm == tr_tm &&
        (iVar5 = checkColumnOverlap(pTrigger->pColumns,pChanges), iVar5 != 0)))) {
      if (pTrigger->bReturning == '\0') {
        sqlite3CodeRowTriggerDirect(pParse,pTrigger,pTab,reg,orconf,ignoreJump);
      }
      else if (pParse->pToplevel == (Parse *)0x0) {
        db = pParse->db;
        p = pParse->pVdbe;
        pRVar2 = (pParse->u1).pReturning;
        sSelect.pWin = (Window *)0x0;
        sSelect.pWinDefn = (Window *)0x0;
        sSelect.pLimit = (Expr *)0x0;
        sSelect.pWith = (With *)0x0;
        sSelect.pPrior = (Select *)0x0;
        sSelect.pNext = (Select *)0x0;
        sSelect.pHaving = (Expr *)0x0;
        sSelect.pOrderBy = (ExprList *)0x0;
        sSelect.pWhere = (Expr *)0x0;
        sSelect.pGroupBy = (ExprList *)0x0;
        sSelect.pEList = (ExprList *)0x0;
        sSelect.pSrc = (SrcList *)0x0;
        sSelect.selId = 0;
        sSelect.addrOpenEphm[0] = 0;
        sSelect.addrOpenEphm[1] = 0;
        sSelect._28_4_ = 0;
        sSelect.op = '\0';
        sSelect._1_1_ = 0;
        sSelect.nSelectRow = 0;
        sSelect.selFlags = 0;
        sSelect.iLimit = 0;
        sSelect.iOffset = 0;
        sFrom.nSrc = 0;
        sFrom.nAlloc = 0;
        sFrom.a[0].pSchema = (Schema *)0x0;
        sFrom.a[0].zDatabase = (char *)0x0;
        sFrom.a[0].zName = (char *)0x0;
        sFrom.a[0].zAlias = (char *)0x0;
        sFrom.a[0].pTab = (Table *)0x0;
        sFrom.a[0].pSelect = (Select *)0x0;
        sFrom.a[0].addrFillSub = 0;
        sFrom.a[0].regReturn = 0;
        sFrom.a[0].regResult = 0;
        sFrom.a[0].fg = (anon_struct_4_15_a1681e7a_for_fg)0x0;
        sFrom.a[0].iCursor = 0;
        sFrom.a[0]._68_4_ = 0;
        sFrom.a[0].u3.pOn = (Expr *)0x0;
        sFrom.a[0].colUsed = 0;
        sFrom.a[0].u1.zIndexedBy = (char *)0x0;
        sFrom.a[0].u2.pIBIndex = (Index *)0x0;
        sSelect.pEList = sqlite3ExprListDup(db,pRVar2->pReturnEL,0);
        sSelect.pSrc = &sFrom;
        sFrom.nSrc = 1;
        sFrom.a[0].iCursor = -1;
        sFrom.a[0].pTab = pTab;
        sqlite3SelectPrep(pParse,&sSelect,(NameContext *)0x0);
        if (pParse->nErr == 0) {
          sqlite3GenerateColumnNames(pParse,&sSelect);
        }
        sqlite3ExprListDelete(db,sSelect.pEList);
        pEVar3 = pRVar2->pReturnEL;
        db_00 = pParse->db;
        pList = (ExprList *)0x0;
        for (lVar8 = 0; lVar8 < pEVar3->nExpr; lVar8 = lVar8 + 1) {
          pEVar6 = pEVar3->a[lVar8].pExpr;
          if (pEVar6 != (Expr *)0x0) {
            if (pEVar6->op != 0xb4) {
              if ((pEVar6->op != 0x8d) || (pEVar6->pRight->op != 0xb4)) {
                pEVar6 = sqlite3ExprDup(db_00,pEVar6,0);
                pList = sqlite3ExprListAppend(pParse,pList,pEVar6);
                if (db_00->mallocFailed == '\0') {
                  pcVar7 = pEVar3->a[lVar8].zEName;
                  if (pcVar7 != (char *)0x0) {
                    lVar9 = (long)pList->nExpr;
                    pcVar7 = sqlite3DbStrDup(db_00,pcVar7);
                    pList->a[lVar9 + -1].zEName = pcVar7;
                    *(ushort *)&pList->a[lVar9 + -1].fg.field_0x1 =
                         *(ushort *)&pList->a[lVar9 + -1].fg.field_0x1 & 0xfffc |
                         *(ushort *)&pEVar3->a[lVar8].fg.field_0x1 & 3;
                  }
                }
                goto LAB_001b2265;
              }
              sqlite3ErrorMsg(pParse,"RETURNING may not use \"TABLE.*\" wildcards");
            }
            lVar9 = 0;
            for (lVar10 = 0; lVar10 < pTab->nCol; lVar10 = lVar10 + 1) {
              if ((*(byte *)((long)&pTab->aCol->colFlags + lVar9) & 2) == 0) {
                pEVar6 = sqlite3Expr(db_00,0x3b,*(char **)((long)&pTab->aCol->zCnName + lVar9));
                pList = sqlite3ExprListAppend(pParse,pList,pEVar6);
                if (db_00->mallocFailed == '\0') {
                  iVar5 = pList->nExpr;
                  pcVar7 = sqlite3DbStrDup(db_00,*(char **)((long)&pTab->aCol->zCnName + lVar9));
                  pList->a[(long)iVar5 + -1].zEName = pcVar7;
                  puVar1 = &pList->a[(long)iVar5 + -1].fg.field_0x1;
                  *puVar1 = *puVar1 & 0xfc;
                }
              }
              lVar9 = lVar9 + 0x10;
            }
          }
LAB_001b2265:
        }
        if (db->mallocFailed == '\0') {
          local_168.nRef = 0;
          local_168.nNcErr = 0;
          local_168.pWinSelect = (Select *)0x0;
          local_168.pNext = (NameContext *)0x0;
          local_168.pSrcList = (SrcList *)0x0;
          if (pRVar2->nRetCol == 0) {
            pRVar2->nRetCol = pList->nExpr;
            iVar5 = pParse->nTab;
            pParse->nTab = iVar5 + 1;
            pRVar2->iRetCur = iVar5;
          }
          local_168.uNC._4_4_ = 0;
          local_168.uNC.iBaseReg = reg;
          local_168.ncFlags = 0x400;
          local_168._44_4_ = 0;
          pParse->eTriggerOp = pTrigger->op;
          pParse->pTriggerTab = pTab;
          local_168.pParse = pParse;
          iVar5 = sqlite3ResolveExprListNames(&local_168,pList);
          if ((iVar5 == 0) && (db->mallocFailed == '\0')) {
            p2 = pList->nExpr;
            iVar5 = pParse->nMem + 1;
            pParse->nMem = p2 + pParse->nMem + 2;
            if ((int)p2 < 1) {
              p2 = 0;
            }
            pRVar2->iRetReg = iVar5;
            iVar11 = iVar5;
            for (lVar8 = 0; (ulong)p2 * 0x18 != lVar8; lVar8 = lVar8 + 0x18) {
              pEVar6 = *(Expr **)((long)&pList->a[0].pExpr + lVar8);
              sqlite3ExprCodeFactorable(pParse,pEVar6,iVar11);
              cVar4 = sqlite3ExprAffinity(pEVar6);
              if (cVar4 == 'E') {
                sqlite3VdbeAddOp1(p,0x57,iVar11);
              }
              iVar11 = iVar11 + 1;
            }
            sqlite3VdbeAddOp3(p,0x61,iVar5,p2,iVar5 + p2);
            iVar11 = p2 + iVar5 + 1;
            sqlite3VdbeAddOp2(p,0x7f,pRVar2->iRetCur,iVar11);
            sqlite3VdbeAddOp3(p,0x80,pRVar2->iRetCur,iVar5 + p2,iVar11);
          }
        }
        sqlite3ExprListDelete(db,pList);
        pParse->eTriggerOp = '\0';
        pParse->pTriggerTab = (Table *)0x0;
      }
    }
    pTrigger = pTrigger->pNext;
  } while( true );
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeRowTrigger(
  Parse *pParse,       /* Parse context */
  Trigger *pTrigger,   /* List of triggers on table pTab */
  int op,              /* One of TK_UPDATE, TK_INSERT, TK_DELETE */
  ExprList *pChanges,  /* Changes list for any UPDATE OF triggers */
  int tr_tm,           /* One of TRIGGER_BEFORE, TRIGGER_AFTER */
  Table *pTab,         /* The table to code triggers from */
  int reg,             /* The first in an array of registers (see above) */
  int orconf,          /* ON CONFLICT policy */
  int ignoreJump       /* Instruction to jump to for RAISE(IGNORE) */
){
  Trigger *p;          /* Used to iterate through pTrigger list */

  assert( op==TK_UPDATE || op==TK_INSERT || op==TK_DELETE );
  assert( tr_tm==TRIGGER_BEFORE || tr_tm==TRIGGER_AFTER );
  assert( (op==TK_UPDATE)==(pChanges!=0) );

  for(p=pTrigger; p; p=p->pNext){

    /* Sanity checking:  The schema for the trigger and for the table are
    ** always defined.  The trigger must be in the same schema as the table
    ** or else it must be a TEMP trigger. */
    assert( p->pSchema!=0 );
    assert( p->pTabSchema!=0 );
    assert( p->pSchema==p->pTabSchema
         || p->pSchema==pParse->db->aDb[1].pSchema );

    /* Determine whether we should code this trigger.  One of two choices:
    **   1. The trigger is an exact match to the current DML statement
    **   2. This is a RETURNING trigger for INSERT but we are currently
    **      doing the UPDATE part of an UPSERT.
    */
    if( (p->op==op || (p->bReturning && p->op==TK_INSERT && op==TK_UPDATE))
     && p->tr_tm==tr_tm
     && checkColumnOverlap(p->pColumns, pChanges)
    ){
      if( !p->bReturning ){
        sqlite3CodeRowTriggerDirect(pParse, p, pTab, reg, orconf, ignoreJump);
      }else if( sqlite3IsToplevel(pParse) ){
        codeReturningTrigger(pParse, p, pTab, reg);
      }
    }
  }
}